

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_support.c
# Opt level: O1

int32_t per_get_few_bits(asn_per_data_t *pd,int nbits)

{
  uint *puVar1;
  int32_t iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  char cVar7;
  size_t sVar8;
  uint uVar9;
  int nbits_00;
  long lVar10;
  asn_per_data_t local_68;
  
  uVar9 = 0;
  uVar4 = 0xffffffff;
LAB_0014ceb6:
  if (nbits < 0) {
LAB_0014d022:
    return uVar9 | uVar4;
  }
  uVar6 = pd->nboff;
  lVar10 = pd->nbits - uVar6;
  uVar5 = (ulong)(uint)nbits;
  if (lVar10 < (long)uVar5) {
    if ((0x1f < nbits) || (pd->refill == (_func_int_asn_per_data_s_ptr *)0x0)) goto LAB_0014d022;
    nbits_00 = (int)lVar10;
    iVar2 = per_get_few_bits(pd,nbits_00);
    if (iVar2 < 0) goto LAB_0014d022;
    iVar3 = (*pd->refill)(pd);
    if (iVar3 != 0) goto LAB_0014d022;
    nbits = nbits - nbits_00;
    uVar9 = uVar9 | iVar2 << ((byte)nbits & 0x1f);
    goto LAB_0014ceb6;
  }
  if (7 < uVar6) {
    pd->buffer = pd->buffer + (uVar6 >> 3);
    pd->nbits = pd->nbits - (uVar6 & 0xfffffffffffffff8);
    pd->nboff = (ulong)((uint)uVar6 & 7);
  }
  sVar8 = pd->moved + uVar5;
  pd->moved = sVar8;
  uVar6 = pd->nboff + uVar5;
  pd->nboff = uVar6;
  puVar1 = (uint *)pd->buffer;
  if (uVar6 < 9) {
    if (nbits != 0) {
      uVar4 = (uint)(byte)*puVar1;
      cVar7 = '\b';
      goto LAB_0014cf9b;
    }
    uVar4 = 0;
  }
  else {
    if (uVar6 < 0x11) {
      uVar4 = (uint)(ushort)((ushort)*puVar1 << 8 | (ushort)*puVar1 >> 8);
      cVar7 = '\x10';
    }
    else {
      if (0x18 < uVar6) {
        if (uVar6 < 0x20) {
          uVar4 = *puVar1;
          uVar4 = (int)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                       uVar4 << 0x18) >> (-(char)uVar6 & 0x1fU);
          goto LAB_0014d010;
        }
        if (0x1f < nbits) {
          if ((long)uVar5 <= (long)uVar6) {
            pd->nboff = uVar6 - uVar5;
            pd->moved = sVar8 - uVar5;
          }
          goto LAB_0014d022;
        }
        local_68.buffer = pd->buffer;
        local_68.nboff = pd->nboff;
        local_68.nbits = pd->nbits;
        local_68.moved = pd->moved;
        local_68.refill = pd->refill;
        local_68.refill_key = pd->refill_key;
        if ((long)uVar5 <= (long)local_68.nboff) {
          local_68.moved = local_68.moved - uVar5;
          local_68.nboff = local_68.nboff - uVar5;
        }
        iVar2 = per_get_few_bits(&local_68,nbits - 0x18);
        uVar4 = per_get_few_bits(&local_68,0x18);
        uVar4 = uVar4 | iVar2 << 0x18;
        goto LAB_0014d010;
      }
      uVar4 = (uint)*(byte *)((long)puVar1 + 2) |
              (uint)*(byte *)((long)puVar1 + 1) << 8 | (uint)(byte)*puVar1 << 0x10;
      cVar7 = '\x18';
    }
LAB_0014cf9b:
    uVar4 = uVar4 >> (cVar7 - (char)uVar6 & 0x1fU);
  }
LAB_0014d010:
  uVar4 = ~(-1 << ((byte)nbits & 0x1f)) & uVar4;
  goto LAB_0014d022;
}

Assistant:

int32_t
per_get_few_bits(asn_per_data_t *pd, int nbits) {
	size_t off;	/* Next after last bit offset */
	ssize_t nleft;	/* Number of bits left in this stream */
	uint32_t accum;
	const uint8_t *buf;

	if(nbits < 0)
		return -1;

	nleft = pd->nbits - pd->nboff;
	if(nbits > nleft) {
		int32_t tailv, vhead;
		if(!pd->refill || nbits > 31) return -1;
		/* Accumulate unused bytes before refill */
		ASN_DEBUG("Obtain the rest %d bits (want %d)",
			(int)nleft, (int)nbits);
		tailv = per_get_few_bits(pd, nleft);
		if(tailv < 0) return -1;
		/* Refill (replace pd contents with new data) */
		if(pd->refill(pd))
			return -1;
		nbits -= nleft;
		vhead = per_get_few_bits(pd, nbits);
		/* Combine the rest of previous pd with the head of new one */
		tailv = (tailv << nbits) | vhead;  /* Could == -1 */
		return tailv;
	}

	/*
	 * Normalize position indicator.
	 */
	if(pd->nboff >= 8) {
		pd->buffer += (pd->nboff >> 3);
		pd->nbits  -= (pd->nboff & ~0x07);
		pd->nboff  &= 0x07;
	}
	pd->moved += nbits;
	pd->nboff += nbits;
	off = pd->nboff;
	buf = pd->buffer;

	/*
	 * Extract specified number of bits.
	 */
	if(off <= 8)
		accum = nbits ? (buf[0]) >> (8 - off) : 0;
	else if(off <= 16)
		accum = ((buf[0] << 8) + buf[1]) >> (16 - off);
	else if(off <= 24)
		accum = ((buf[0] << 16) + (buf[1] << 8) + buf[2]) >> (24 - off);
	else if(off <= 31)
		accum = ((buf[0] << 24) + (buf[1] << 16)
			+ (buf[2] << 8) + (buf[3])) >> (32 - off);
	else if(nbits <= 31) {
		asn_per_data_t tpd = *pd;
		/* Here are we with our 31-bits limit plus 1..7 bits offset. */
		per_get_undo(&tpd, nbits);
		/* The number of available bits in the stream allow
		 * for the following operations to take place without
		 * invoking the ->refill() function */
		accum  = per_get_few_bits(&tpd, nbits - 24) << 24;
		accum |= per_get_few_bits(&tpd, 24);
	} else {
		per_get_undo(pd, nbits);
		return -1;
	}

	accum &= (((uint32_t)1 << nbits) - 1);

	ASN_DEBUG("  [PER got %2d<=%2d bits => span %d %+ld[%d..%d]:%02x (%d) => 0x%x]",
		(int)nbits, (int)nleft,
		(int)pd->moved,
		(((long)pd->buffer) & 0xf),
		(int)pd->nboff, (int)pd->nbits,
		((pd->buffer != NULL)?pd->buffer[0]:0),
		(int)(pd->nbits - pd->nboff),
		(int)accum);

	return accum;
}